

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O3

ngram_raw_t **
ngrams_raw_read_arpa(lineiter_t **li,logmath_t *lmath,uint32 *counts,int order,hash_table_t *wid)

{
  ulong uVar1;
  char *__s1;
  int iVar2;
  uint uVar3;
  ngram_raw_t **raw_ngrams;
  lineiter_t *plVar4;
  ngram_raw_t *pnVar5;
  uint32 *puVar6;
  ulong n_elem;
  uint32 *val;
  size_t __nmemb;
  uint uVar7;
  char **ppcVar8;
  float fVar9;
  float32 fVar10;
  double dVar11;
  int words_expected;
  char *wptr [6];
  char local_88 [32];
  char *local_68 [7];
  
  raw_ngrams = (ngram_raw_t **)
               __ckd_calloc__((long)(order + -1),8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                              ,0xae);
  if (1 < order) {
    n_elem = 2;
    do {
      sprintf(local_88,"\\%d-grams:");
      plVar4 = *li;
      while( true ) {
        if (plVar4 == (lineiter_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                  ,0x90,"Failed to find \'%s\', language model file truncated\n",local_88);
          goto LAB_00110e65;
        }
        iVar2 = strcmp(plVar4->buf,local_88);
        if (iVar2 == 0) break;
        plVar4 = lineiter_next(plVar4);
        *li = plVar4;
      }
      pnVar5 = (ngram_raw_t *)
               __ckd_calloc__((ulong)counts[n_elem - 1],0x18,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                              ,0x94);
      raw_ngrams[n_elem - 2] = pnVar5;
      uVar1 = n_elem + 1;
      if (counts[n_elem - 1] == 0) {
        __nmemb = 0;
      }
      else {
        __nmemb = 0;
        uVar7 = 0;
        do {
          if (*li == (lineiter_t *)0x0) break;
          plVar4 = lineiter_next(*li);
          *li = plVar4;
          if (plVar4 == (lineiter_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                    ,0x99,"Unexpected end of ARPA file. Failed to read %d-gram\n",n_elem);
            goto LAB_00110e65;
          }
          pnVar5 = raw_ngrams[n_elem - 2] + __nmemb;
          uVar3 = str2words(plVar4->buf,local_68,6);
          if ((long)n_elem < (long)(int)uVar3) {
            pnVar5->order = (uint32)n_elem;
            dVar11 = atof_c(local_68[0]);
            fVar9 = (float)dVar11;
            if (n_elem == (uint)order) {
              pnVar5->prob = (float32)fVar9;
              if (0.0 < fVar9) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                        ,0x5d,"%d-gram \'%s\' has positive probability\n",(ulong)(uint)order,
                        local_68[1]);
                pnVar5->prob = 0.0;
                fVar9 = 0.0;
              }
              fVar9 = logmath_log10_to_log_float(lmath,(float64)(double)fVar9);
              pnVar5->prob = (float32)fVar9;
            }
            else {
              if (fVar9 <= 0.0) {
                fVar10 = (float32)logmath_log10_to_log_float(lmath,(float64)(double)fVar9);
              }
              else {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                        ,0x68,"%d-gram \'%s\' has positive probability\n",n_elem & 0xffffffff,
                        local_68[1]);
                fVar10 = 0.0;
              }
              pnVar5->prob = fVar10;
              if (uVar1 == uVar3) {
                pnVar5->backoff = 0.0;
              }
              else {
                dVar11 = atof_c(local_68[uVar1]);
                fVar9 = logmath_log10_to_log_float(lmath,(float64)(double)(float)dVar11);
                pnVar5->backoff = (float32)fVar9;
              }
            }
            puVar6 = (uint32 *)
                     __ckd_calloc__(n_elem,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                                    ,0x7a);
            pnVar5->words = puVar6;
            val = puVar6 + (n_elem - 1);
            if (puVar6 <= val) {
              ppcVar8 = local_68;
              do {
                ppcVar8 = ppcVar8 + 1;
                hash_table_lookup_int32(wid,*ppcVar8,(int32 *)val);
                val = val + -1;
              } while (pnVar5->words <= val);
            }
            __nmemb = (size_t)((int)__nmemb + 1);
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                    ,0x54,"Format error; %d-gram ignored at line %d\n",n_elem & 0xffffffff,
                    (ulong)(uint)plVar4->lineno);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < counts[n_elem - 1]);
        pnVar5 = raw_ngrams[n_elem - 2];
      }
      counts[n_elem - 1] = (uint32)__nmemb;
      qsort(pnVar5,__nmemb,0x18,ngram_ord_comparator);
      n_elem = uVar1;
    } while (uVar1 != order + 1);
  }
LAB_00110e65:
  if (*li == (lineiter_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
            ,0xb8,"ARPA file ends without end-mark\n");
    ngrams_raw_free(raw_ngrams,counts,order);
    raw_ngrams = (ngram_raw_t **)0x0;
  }
  else {
    plVar4 = lineiter_next(*li);
    *li = plVar4;
    __s1 = plVar4->buf;
    iVar2 = strcmp(__s1,"\\end\\");
    if (iVar2 != 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
              ,0xc0,"Finished reading ARPA file. Expecting end mark but found \'%s\'\n",__s1);
    }
  }
  return raw_ngrams;
}

Assistant:

ngram_raw_t **
ngrams_raw_read_arpa(lineiter_t ** li, logmath_t * lmath, uint32 * counts,
                     int order, hash_table_t * wid)
{
    ngram_raw_t **raw_ngrams;
    int order_it;

    raw_ngrams =
        (ngram_raw_t **) ckd_calloc(order - 1, sizeof(*raw_ngrams));

    for (order_it = 2; order_it <= order; order_it++) {
        if (ngrams_raw_read_section(&raw_ngrams[order_it - 2], li, wid, lmath,
                              counts + order_it - 1, order_it, order) < 0)
        break;
    }

    /* Check if we found ARPA end-mark */
    if (*li == NULL) {
        E_ERROR("ARPA file ends without end-mark\n");
	ngrams_raw_free(raw_ngrams, counts, order);
        return NULL;
    } else {
        *li = lineiter_next(*li);
	if (strcmp((*li)->buf, "\\end\\") != 0) {
    	    E_WARN
        	("Finished reading ARPA file. Expecting end mark but found '%s'\n",
        	 (*li)->buf);
        }
    }

    return raw_ngrams;
}